

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

char * Wlc_ObjName(Wlc_Ntk_t *p,int iObj)

{
  Abc_Nam_t *p_00;
  int iVar1;
  char *pcVar2;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_NtkHasNameId(p);
  if ((iVar1 != 0) && (iVar1 = Wlc_ObjNameId(p,iObj), iVar1 != 0)) {
    p_00 = p->pManName;
    iVar1 = Wlc_ObjNameId(p,iObj);
    pcVar2 = Abc_NamStr(p_00,iVar1);
    return pcVar2;
  }
  sprintf(Wlc_ObjName::Buffer,"n%d",(ulong)(uint)iObj);
  return Wlc_ObjName::Buffer;
}

Assistant:

char * Wlc_ObjName( Wlc_Ntk_t * p, int iObj )
{
    static char Buffer[100];
    if ( Wlc_NtkHasNameId(p) && Wlc_ObjNameId(p, iObj) )
        return Abc_NamStr( p->pManName, Wlc_ObjNameId(p, iObj) );
    sprintf( Buffer, "n%d", iObj );
    return Buffer;
}